

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O1

void __thiscall
OpenMD::HBondJump::processOverlapping(HBondJump *this,int frame,SelectionManager *sman)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  pointer ppAVar4;
  pointer pvVar5;
  pointer ppHVar6;
  long lVar7;
  long lVar8;
  Molecule *pMVar9;
  HBondDonor *pHVar10;
  Atom *pAVar11;
  Molecule *pMVar12;
  pointer ppHVar13;
  ulong uVar14;
  pointer ppAVar15;
  ulong uVar16;
  int j;
  int i;
  int local_58;
  int local_54;
  long local_50;
  HBondJump *local_48;
  Molecule *local_40;
  pointer local_38;
  
  local_48 = this;
  pMVar9 = SelectionManager::beginSelectedMolecule(sman,&local_54);
  if (pMVar9 != (Molecule *)0x0) {
    local_50 = (long)frame;
    do {
      ppHVar13 = (pMVar9->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = local_58;
      local_58 = local_54;
      ppHVar6 = local_38;
      if (ppHVar13 ==
          (pMVar9->hBondDonors_).
          super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pHVar10 = (HBondDonor *)0x0;
      }
      else {
        pHVar10 = *ppHVar13;
      }
      while (local_38 = ppHVar13, local_54 = local_58, pHVar10 != (HBondDonor *)0x0) {
        iVar2 = *(int *)(*(long *)&(local_48->GIDtoH_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_50].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data +
                        (long)(pHVar10->donatedHydrogen->super_StuntDouble).globalIndex_ * 4);
        uVar16 = (ulong)iVar2;
        iVar3 = *(int *)(*(long *)&(local_48->acceptor_).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_50].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data + uVar16 * 4);
        local_40 = pMVar9;
        pMVar9 = SelectionManager::nextSelectedMolecule(sman,&local_58);
        if (pMVar9 != (Molecule *)0x0) {
          uVar14 = uVar16 + 0x3f;
          if (-1 < (long)uVar16) {
            uVar14 = uVar16;
          }
          do {
            ppAVar15 = (pMVar9->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppAVar4 = (pMVar9->hBondAcceptors_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppAVar15 == ppAVar4) {
              pAVar11 = (Atom *)0x0;
            }
            else {
              pAVar11 = *ppAVar15;
            }
            if (pAVar11 != (Atom *)0x0) {
              pvVar5 = (local_48->selected_).
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              do {
                ppAVar15 = ppAVar15 + 1;
                if ((pAVar11->super_StuntDouble).globalIndex_ == iVar3) {
                  puVar1 = (ulong *)((ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8
                                     + -8 + *(long *)&pvVar5[local_50].
                                                      super__Bvector_base<std::allocator<bool>_>.
                                                      _M_impl.super__Bvector_impl_data +
                                            ((long)uVar14 >> 6) * 8);
                  *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
                }
                if (ppAVar15 == ppAVar4) {
                  pAVar11 = (Atom *)0x0;
                }
                else {
                  pAVar11 = *ppAVar15;
                }
              } while (pAVar11 != (Atom *)0x0);
            }
            pMVar9 = SelectionManager::nextSelectedMolecule(sman,&local_58);
          } while (pMVar9 != (Molecule *)0x0);
        }
        ppHVar13 = local_38 + 1;
        iVar2 = local_58;
        pMVar9 = local_40;
        local_58 = local_54;
        ppHVar6 = local_38;
        if (ppHVar13 ==
            (local_40->hBondDonors_).
            super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pHVar10 = (HBondDonor *)0x0;
        }
        else {
          pHVar10 = *ppHVar13;
        }
      }
      ppAVar15 = (pMVar9->hBondAcceptors_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_38 = ppHVar6;
      while( true ) {
        local_58 = iVar2;
        if (ppAVar15 ==
            (pMVar9->hBondAcceptors_).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pAVar11 = (Atom *)0x0;
        }
        else {
          pAVar11 = *ppAVar15;
        }
        if (pAVar11 == (Atom *)0x0) break;
        iVar2 = (pAVar11->super_StuntDouble).globalIndex_;
        local_58 = local_54;
        while (pMVar12 = SelectionManager::nextSelectedMolecule(sman,&local_58),
              pMVar12 != (Molecule *)0x0) {
          ppHVar13 = (pMVar12->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppHVar6 = (pMVar12->hBondDonors_).
                    super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (ppHVar13 == ppHVar6) {
            pHVar10 = (HBondDonor *)0x0;
          }
          else {
            pHVar10 = *ppHVar13;
          }
          if (pHVar10 != (HBondDonor *)0x0) {
            lVar7 = *(long *)&(local_48->GIDtoH_).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_50].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data;
            lVar8 = *(long *)&(local_48->acceptor_).
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_50].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data;
            pvVar5 = (local_48->selected_).
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            do {
              ppHVar13 = ppHVar13 + 1;
              iVar3 = *(int *)(lVar7 + (long)(pHVar10->donatedHydrogen->super_StuntDouble).
                                             globalIndex_ * 4);
              uVar16 = (ulong)iVar3;
              if (*(int *)(lVar8 + uVar16 * 4) == iVar2) {
                uVar14 = uVar16 + 0x3f;
                if (-1 < (long)uVar16) {
                  uVar14 = uVar16;
                }
                puVar1 = (ulong *)(((long)uVar14 >> 6) * 8 +
                                   *(long *)&pvVar5[local_50].
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data + -8 +
                                  (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001) * 8);
                *puVar1 = *puVar1 | 1L << ((byte)iVar3 & 0x3f);
              }
              if (ppHVar13 == ppHVar6) {
                pHVar10 = (HBondDonor *)0x0;
              }
              else {
                pHVar10 = *ppHVar13;
              }
            } while (pHVar10 != (HBondDonor *)0x0);
          }
        }
        ppAVar15 = ppAVar15 + 1;
        iVar2 = local_58;
      }
      pMVar9 = SelectionManager::nextSelectedMolecule(sman,&local_54);
    } while (pMVar9 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void HBondJump::processOverlapping(int frame, SelectionManager& sman) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;

    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    for (mol1 = sman.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman.nextSelectedMolecule(i)) {
      // loop over the possible donors in molecule 1:
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];
        aInd  = acceptor_[frame][index];

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aInd = hba->getGlobalIndex();

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd  = hbd->donatedHydrogen->getGlobalIndex();
            index = GIDtoH_[frame][hInd];

            if (acceptor_[frame][index] == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }